

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nearest_neighbor.cc
# Opt level: O0

void __thiscall
features::NearestNeighbor<float>::find(NearestNeighbor<float> *this,float *query,Result *result)

{
  float *pfVar1;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  Result *local_20;
  Result *result_local;
  float *query_local;
  NearestNeighbor<float> *this_local;
  
  result->dist_1st_best = 0.0;
  result->dist_2nd_best = 0.0;
  result->index_1st_best = 0;
  result->index_2nd_best = 0;
  local_20 = result;
  result_local = (Result *)query;
  query_local = (float *)this;
  anon_unknown_1::float_inner_prod(query,result,this->elements,this->num_elements,this->dimensions);
  local_24 = 0.0;
  local_28 = 2.0 - (local_20->dist_1st_best + local_20->dist_1st_best);
  pfVar1 = std::max<float>(&local_24,&local_28);
  local_20->dist_1st_best = *pfVar1;
  local_2c = 0.0;
  local_30 = 2.0 - (local_20->dist_2nd_best + local_20->dist_2nd_best);
  pfVar1 = std::max<float>(&local_2c,&local_30);
  local_20->dist_2nd_best = *pfVar1;
  return;
}

Assistant:

void
NearestNeighbor<float>::find (float const* query,
    NearestNeighbor<float>::Result* result) const
{
    /* Result distances are shamelessly misused to store inner products. */
    result->dist_1st_best = 0.0f;
    result->dist_2nd_best = 0.0f;
    result->index_1st_best = 0;
    result->index_2nd_best = 0;

    float_inner_prod(query, result, this->elements,
        this->num_elements, this->dimensions);

    /*
     * Compute actual (square) distances.
     */
    result->dist_1st_best = std::max(0.0f, 2.0f - 2.0f * result->dist_1st_best);
    result->dist_2nd_best = std::max(0.0f, 2.0f - 2.0f * result->dist_2nd_best);
}